

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Texture2D * LoadTextureFromImage(Image image)

{
  uint uVar1;
  Texture2D *in_RDI;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  
  in_RDI->id = 0;
  if (in_stack_00000014 == 0 || (in_stack_00000010 == 0 || in_stack_00000008 == (void *)0x0)) {
    TraceLog(4,"IMAGE: Data is not valid to load texture");
  }
  else {
    uVar1 = rlLoadTexture(in_stack_00000008,in_stack_00000010,in_stack_00000014,in_stack_0000001c,
                          in_stack_00000018);
    in_RDI->id = uVar1;
  }
  in_RDI->width = in_stack_00000010;
  in_RDI->height = in_stack_00000014;
  in_RDI->mipmaps = in_stack_00000018;
  in_RDI->format = in_stack_0000001c;
  return in_RDI;
}

Assistant:

Texture2D LoadTextureFromImage(Image image)
{
    Texture2D texture = { 0 };

    if ((image.data != NULL) && (image.width != 0) && (image.height != 0))
    {
        texture.id = rlLoadTexture(image.data, image.width, image.height, image.format, image.mipmaps);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Data is not valid to load texture");

    texture.width = image.width;
    texture.height = image.height;
    texture.mipmaps = image.mipmaps;
    texture.format = image.format;

    return texture;
}